

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

bool __thiscall
notch::core::EpochCallback::operator()(EpochCallback *this,int currentEpoch,bool alwaysInvoke)

{
  bool alwaysInvoke_local;
  int currentEpoch_local;
  EpochCallback *this_local;
  
  if ((alwaysInvoke) || ((0 < this->period && (currentEpoch % this->period == 0)))) {
    this_local._7_1_ = std::function<bool_(int)>::operator()(&this->callback,currentEpoch);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(int currentEpoch, bool alwaysInvoke = false) const {
        if (alwaysInvoke || (period > 0 && currentEpoch % period == 0)) {
            return callback(currentEpoch);
        } else {
            return false;
        }
    }